

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crash.h
# Opt level: O3

void __thiscall bandit::reporter::crash::it_failed(crash *this,string *desc,assertion_exception *ex)

{
  int *piVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  failure_formatter_t *pfVar4;
  ostream *poVar5;
  _List_node_base *p_Var6;
  stringstream ss;
  string local_1e8;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  piVar1 = &(this->super_progress_base).specs_failed_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::stringstream::stringstream(local_1a8);
  progress_base::current_context_name_abi_cxx11_(&local_1e8,&this->super_progress_base);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(desc->_M_dataplus)._M_p,desc->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  poVar5 = (ostream *)std::ostream::flush();
  pfVar4 = (this->super_progress_base).failure_formatter_;
  (*pfVar4->_vptr_interface[2])(&local_1c8,pfVar4,ex);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1c8,local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  paVar3 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  p_Var6 = (_List_node_base *)operator_new(0x30);
  p_Var6[1]._M_next = p_Var6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p == paVar3) {
    p_Var6[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,local_1e8.field_2._M_local_buf[0]);
    p_Var6[2]._M_prev = (_List_node_base *)local_1e8.field_2._8_8_;
  }
  else {
    p_Var6[1]._M_next = (_List_node_base *)local_1e8._M_dataplus._M_p;
    p_Var6[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,local_1e8.field_2._M_local_buf[0]);
  }
  p_Var6[1]._M_prev = (_List_node_base *)local_1e8._M_string_length;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)paVar3;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar2 = &(this->super_progress_base).failures_.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  poVar5 = this->stm_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"FAILED",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        ++specs_failed_;

        std::stringstream ss;
        ss << current_context_name() << " " << desc << ":" << std::endl
           << failure_formatter_.format(ex);
        failures_.push_back(ss.str());

        stm_ << "FAILED" << std::endl;
      }